

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O1

void emit_fold(BuildCtx *ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  FILE *__stream;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  byte bVar12;
  byte bVar13;
  dasm_State *pdVar14;
  size_t sVar15;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint uVar16;
  dasm_State *__s;
  int *unaff_RBP;
  int in_ESI;
  uint uVar17;
  dasm_State *pdVar18;
  char *pcVar19;
  char *pcVar20;
  uint *puVar21;
  BuildCtx *pBVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  uint32_t uVar26;
  ulong uVar27;
  bool bVar28;
  char buf [256];
  uint32_t htab [8193];
  int local_8138;
  short local_8134;
  char local_8132;
  char local_8131;
  undefined1 local_8130 [248];
  char *local_8038 [4097];
  
  pBVar22 = (BuildCtx *)*ctx->args;
  if (pBVar22 == (BuildCtx *)0x0) {
LAB_0010ad8f:
    emit_fold_cold_6();
  }
  else {
    if ((*(char *)&pBVar22->D == '-') &&
       (__stream = _stdin, *(char *)((long)&pBVar22->D + 1) == '\0')) {
LAB_0010aa3c:
      fwrite("/* This is a generated file. DO NOT EDIT! */\n\n",0x2e,1,(FILE *)ctx->fp);
      fwrite("static const FoldFunc fold_func[] = {\n",0x26,1,(FILE *)ctx->fp);
      lineno = 0;
      funcidx = 0;
      nkeys = 0;
      pcVar8 = fgets((char *)&local_8138,0x100,__stream);
      pcVar9 = (char *)ctx;
      if (pcVar8 != (char *)0x0) {
        unaff_RBP = &local_8138;
        do {
          lineno = lineno + 1;
          if (local_8134 == 0x444c && local_8138 == 0x4f464a4c) {
            pcVar9 = strchr(&local_8132,0x29);
            if (pcVar9 == (char *)0x0 || local_8132 != '(') {
              if ((((local_8132 != 'X') && (local_8132 != 'F')) || (local_8131 != '(')) ||
                 (pcVar9 == (char *)0x0)) {
LAB_0010ad78:
                in_ESI = (int)&local_8132;
                emit_fold_cold_2();
                goto LAB_0010ad8a;
              }
              *pcVar9 = '\0';
              if (funcidx != 0) {
                fwrite(",\n",2,1,(FILE *)ctx->fp);
              }
              pcVar9 = "  fold_%s";
              if (local_8132 == 'X') {
                pcVar9 = "  %s";
              }
              fprintf((FILE *)ctx->fp,pcVar9,local_8130);
              funcidx = funcidx + 1;
              pBVar22 = ctx;
            }
            else {
              *pcVar9 = '\0';
              local_8038[0] = &local_8131;
              uVar2 = nexttoken(local_8038,0,0);
              pBVar22 = (BuildCtx *)(ulong)uVar2;
              uVar3 = nexttoken(local_8038,0,0x7f);
              in_ESI = 1;
              uVar4 = nexttoken(local_8038,1,0x3ff);
              uVar1 = nkeys;
              uVar26 = funcidx;
              uVar10 = (ulong)nkeys;
              if (0xfff < uVar10) {
LAB_0010ad8a:
                emit_fold_cold_4();
                goto LAB_0010ad8f;
              }
              pBVar22 = (BuildCtx *)(ulong)(uVar2 << 0x11);
              uVar25 = uVar3 << 10 | uVar2 << 0x11 | uVar4;
              uVar5 = nkeys;
              if (nkeys != 0) {
                uVar17 = uVar25 & 0xffffff;
                puVar21 = foldkeys + uVar10;
                do {
                  uVar5 = (uint)uVar10;
                  uVar23 = foldkeys[uVar5 - 1] & 0xffffff;
                  if (uVar23 < uVar17) goto LAB_0010abcb;
                  if (uVar23 == uVar17) {
                    emit_fold_cold_3();
                    goto LAB_0010ad78;
                  }
                  *puVar21 = foldkeys[uVar5 - 1];
                  puVar21 = puVar21 + -1;
                  uVar10 = uVar10 - 1;
                } while ((ulong)(uVar5 - 1) != 0);
                uVar5 = 0;
              }
LAB_0010abcb:
              foldkeys[uVar5] = uVar25 | uVar26 << 0x18;
              nkeys = uVar1 + 1;
            }
          }
          pcVar8 = fgets((char *)unaff_RBP,0x100,__stream);
          pcVar9 = (char *)foldkeys;
        } while (pcVar8 != (char *)0x0);
      }
      fclose(__stream);
      fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
      uVar26 = nkeys;
      if (nkeys < 0x2000) {
        pcVar9 = "#define fold_hashkey(k)\t(lj_rol(lj_rol((k),%u)-(k),%u)%%%u)\n\n";
        uVar5 = nkeys | 1;
        do {
          unaff_RBP = (int *)0x0;
          do {
            iVar6 = tryhash((uint32_t *)local_8038,uVar5,(uint32_t)unaff_RBP,0);
            pBVar22 = (BuildCtx *)"#define fold_hashkey(k)\t(((((k)<<%u)-(k))<<%u)%%%u)\n\n";
            uVar26 = uVar5;
            if (iVar6 != 0) goto LAB_0010ad1f;
            uVar25 = (uint32_t)unaff_RBP + 1;
            unaff_RBP = (int *)(ulong)uVar25;
          } while (uVar25 != 0x400);
          unaff_RBP = (int *)0x0;
          do {
            iVar6 = tryhash((uint32_t *)local_8038,uVar5,(uint32_t)unaff_RBP,1);
            pBVar22 = (BuildCtx *)pcVar9;
            if (iVar6 != 0) goto LAB_0010ad1f;
            uVar25 = (uint32_t)unaff_RBP + 1;
            unaff_RBP = (int *)(ulong)uVar25;
          } while (uVar25 != 0x400);
          uVar26 = uVar5 + 2;
          bVar28 = uVar5 < 0x1ffe;
          uVar5 = uVar26;
        } while (bVar28);
      }
      emit_fold_cold_5();
      pBVar22 = (BuildCtx *)pcVar9;
LAB_0010ad1f:
      printhash(ctx,(uint32_t *)local_8038,uVar26);
      fprintf((FILE *)ctx->fp,(char *)pBVar22,(ulong)unaff_RBP >> 5 & 0x7ffffff,
              (ulong)((uint)unaff_RBP & 0x1f),(ulong)uVar26);
      return;
    }
    in_ESI = 0x1115b5;
    __stream = fopen64((char *)pBVar22,"r");
    if (__stream != (FILE *)0x0) goto LAB_0010aa3c;
  }
  emit_fold_cold_1();
  __s = pBVar22->D;
  if (__s != (dasm_State *)0x0) {
    pcVar9 = strchr((char *)__s,0x20);
    if (pcVar9 == (char *)0x0) {
      pdVar14 = (dasm_State *)0x0;
    }
    else {
      pdVar14 = (dasm_State *)(pcVar9 + 1);
      *pcVar9 = '\0';
    }
    pBVar22->D = pdVar14;
    if (in_ESI != 0) {
      iVar6 = strncmp((char *)__s,"IRFPM_",6);
      if (iVar6 == 0) {
        pcVar8 = "FLOOR";
        pcVar9 = (char *)((long)&__s->psize + 6);
        uVar10 = 0;
        do {
          pcVar19 = pcVar9;
          iVar7 = strcmp(pcVar8,pcVar9);
          uVar5 = (uint)pcVar19;
          iVar6 = (int)pdVar14;
          if (iVar7 == 0) {
            return;
          }
          uVar10 = (ulong)((int)uVar10 + 1);
          pcVar8 = irfpm_names[uVar10];
        } while (pcVar8 != (char *)0x0);
        goto LAB_0010b07c;
      }
      iVar6 = strncmp((char *)__s,"IRFL_",5);
      if (iVar6 == 0) {
        pcVar8 = "STR_LEN";
        pcVar9 = (char *)((long)&__s->psize + 5);
        uVar10 = 0;
        do {
          pcVar19 = pcVar9;
          iVar7 = strcmp(pcVar8,pcVar9);
          uVar5 = (uint)pcVar19;
          iVar6 = (int)pdVar14;
          if (iVar7 == 0) {
            return;
          }
          uVar10 = (ulong)((int)uVar10 + 1);
          pcVar8 = irfield_names[uVar10];
        } while (pcVar8 != (char *)0x0);
        goto LAB_0010b07c;
      }
      iVar6 = strncmp((char *)__s,"IRCALL_",7);
      if (iVar6 == 0) {
        pcVar8 = "lj_str_cmp";
        pcVar9 = (char *)((long)&__s->psize + 7);
        uVar10 = 0;
        do {
          pcVar19 = pcVar9;
          iVar7 = strcmp(pcVar8,pcVar9);
          uVar5 = (uint)pcVar19;
          iVar6 = (int)pdVar14;
          if (iVar7 == 0) {
            return;
          }
          uVar10 = (ulong)((int)uVar10 + 1);
          pcVar8 = ircall_names[uVar10];
        } while (pcVar8 != (char *)0x0);
        goto LAB_0010b07c;
      }
      uVar5 = 0x113804;
      iVar6 = strncmp((char *)__s,"IRCONV_",7);
      if (iVar6 == 0) {
        pcVar19 = "NIL";
        pcVar9 = (char *)((long)&__s->psize + 7);
        pcVar20 = (char *)0x5f;
        pcVar11 = strchr(pcVar9,0x5f);
        pcVar8 = pcVar11 + 1;
        uVar10 = 0;
        sVar15 = (long)pcVar11 - (long)pcVar9;
        do {
          bVar28 = true;
          if ((pcVar11 != (char *)0x0) &&
             (pcVar20 = pcVar9, iVar6 = strncmp(pcVar19,pcVar9,(long)pcVar11 - (long)pcVar9),
             iVar6 == 0)) {
            bVar28 = false;
            pcVar20 = pcVar8;
            iVar6 = strcmp("NIL",pcVar8);
            uVar27 = 0;
            while (iVar6 != 0) {
              uVar27 = (ulong)((int)uVar27 + 1);
              bVar28 = irt_names[uVar27] == (char *)0x0;
              if (bVar28) break;
              pcVar20 = pcVar8;
              iVar6 = strcmp(irt_names[uVar27],pcVar8);
            }
          }
          uVar5 = (uint)pcVar20;
          iVar6 = (int)sVar15;
          if (!bVar28) {
            return;
          }
          uVar10 = (ulong)((int)uVar10 + 1);
          pcVar19 = irt_names[uVar10];
        } while (pcVar19 != (char *)0x0);
        goto LAB_0010b07c;
      }
      if ((byte)((char)__s->psize - 0x30U) < 10) {
        uVar25 = CONCAT31((int3)((uint)iVar6 >> 8),(char)__s->psize);
        iVar6 = uVar25 - 0x30;
        bVar12 = (byte)iVar6;
        while (bVar12 < 10) {
          bVar12 = *(byte *)((long)&__s->psize + 1);
          uVar25 = (uint)bVar12;
          __s = (dasm_State *)((long)&__s->psize + 1);
          iVar6 = bVar12 - 0x30;
          bVar12 = (byte)iVar6;
        }
        if ((char)uVar25 == '\0') {
          return;
        }
        goto LAB_0010b07c;
      }
    }
    if ((extraout_EDX == 0) || (iVar6 = strcmp("any",(char *)__s), iVar6 != 0)) {
      pcVar9 = "LT";
      uVar10 = 0;
      do {
        pdVar18 = __s;
        iVar7 = strcmp(pcVar9,(char *)__s);
        uVar5 = (uint)pdVar18;
        iVar6 = (int)pdVar14;
        if (iVar7 == 0) {
          return;
        }
        uVar10 = (ulong)((int)uVar10 + 1);
        pcVar9 = ir_names[uVar10];
      } while (pcVar9 != (char *)0x0);
LAB_0010b07c:
      nexttoken_cold_1();
      if ((iVar6 == 0) || (0x1f < extraout_EDX_00 && (extraout_EDX_00 & 0x1f) != 0)) {
        memset(__s,0xff,(ulong)uVar5 * 4 + 4);
        uVar10 = (ulong)nkeys;
        if (uVar10 != 0) {
          bVar12 = (byte)extraout_EDX_00;
          lVar24 = 0;
          do {
            uVar25 = *(uint *)((long)foldkeys + lVar24);
            uVar17 = uVar25 & 0xffffff;
            bVar13 = (byte)(extraout_EDX_00 >> 5);
            if (iVar6 == 0) {
              uVar17 = (uVar17 << (bVar13 & 0x1f)) - uVar17 << (bVar12 & 0x1f);
            }
            else {
              uVar17 = (uVar17 << (bVar13 & 0x1f) | uVar17 >> 0x20 - (bVar13 & 0x1f)) - uVar17;
              uVar17 = uVar17 << (bVar12 & 0x1f) | uVar17 >> 0x20 - (bVar12 & 0x1f);
            }
            uVar27 = (ulong)uVar17 % (ulong)uVar5;
            if (*(int *)((long)&((dasm_State *)(__s->sections + -2))->psize + uVar27 * 4) == -1) {
              puVar21 = (uint *)((long)&((dasm_State *)(__s->sections + -2))->psize + uVar27 * 4);
            }
            else {
              uVar23 = (uint)uVar27;
              puVar21 = (uint *)((long)__s->sections + uVar27 * 4 + -0x4c);
              uVar17 = *puVar21;
              if (uVar17 != 0xffffffff) {
                if (uVar5 - 1 <= uVar23) {
                  return;
                }
                if (*(int *)((long)__s->sections + (long)(int)uVar23 * 4 + -0x48) != -1) {
                  return;
                }
                uVar16 = uVar17 & 0xffffff;
                if (iVar6 == 0) {
                  uVar16 = (uVar16 << (bVar13 & 0x1f)) - uVar16 << (bVar12 & 0x1f);
                }
                else {
                  uVar16 = (uVar16 << (bVar13 & 0x1f) | uVar16 >> 0x20 - (bVar13 & 0x1f)) - uVar16;
                  uVar16 = uVar16 << (bVar12 & 0x1f) | uVar16 >> 0x20 - (bVar12 & 0x1f);
                }
                if (uVar16 % uVar5 != uVar23 + 1) {
                  return;
                }
                *(uint *)((long)__s->sections + (long)(int)uVar23 * 4 + -0x48) = uVar17;
              }
            }
            *puVar21 = uVar25;
            lVar24 = lVar24 + 4;
          } while (uVar10 << 2 != lVar24);
        }
      }
      return;
    }
  }
  return;
}

Assistant:

void emit_fold(BuildCtx *ctx)
{
  char buf[256];  /* We don't care about analyzing lines longer than that. */
  const char *fname = ctx->args[0];
  FILE *fp;

  if (fname == NULL) {
    fprintf(stderr, "Error: missing input filename\n");
    exit(1);
  }

  if (fname[0] == '-' && fname[1] == '\0') {
    fp = stdin;
  } else {
    fp = fopen(fname, "r");
    if (!fp) {
      fprintf(stderr, "Error: cannot open input file '%s': %s\n",
	      fname, strerror(errno));
      exit(1);
    }
  }

  fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  fprintf(ctx->fp, "static const FoldFunc fold_func[] = {\n");

  lineno = 0;
  funcidx = 0;
  nkeys = 0;
  while (fgets(buf, sizeof(buf), fp) != NULL) {
    lineno++;
    /* The prefix must be at the start of a line, otherwise it's ignored. */
    if (!strncmp(buf, FOLDDEF_PREFIX, sizeof(FOLDDEF_PREFIX)-1)) {
      char *p = buf+sizeof(FOLDDEF_PREFIX)-1;
      char *q = strchr(p, ')');
      if (p[0] == '(' && q) {
	p++;
	*q = '\0';
	foldrule(p);
      } else if ((p[0] == 'F' || p[0] == 'X') && p[1] == '(' && q) {
	p += 2;
	*q = '\0';
	if (funcidx)
	  fprintf(ctx->fp, ",\n");
	if (p[-2] == 'X')
	  fprintf(ctx->fp, "  %s", p);
	else
	  fprintf(ctx->fp, "  fold_%s", p);
	funcidx++;
      } else {
	buf[strlen(buf)-1] = '\0';
	fprintf(stderr, "Error: unknown fold definition tag %s%s at line %d\n",
		FOLDDEF_PREFIX, p, lineno);
	exit(1);
      }
    }
  }
  fclose(fp);
  fprintf(ctx->fp, "\n};\n\n");

  makehash(ctx);
}